

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_queue.c
# Opt level: O0

void ItemQueue_add(ItemQueue *item_queue,Item *item)

{
  QueueItem *queue_item_00;
  QueueItem *queue_item;
  Item *item_local;
  ItemQueue *item_queue_local;
  
  queue_item_00 = (QueueItem *)malloc(0x10);
  queue_item_00->item = item;
  queue_item_00->next = (QueueItem *)0x0;
  add(item_queue,queue_item_00);
  return;
}

Assistant:

void ItemQueue_add(ItemQueue* item_queue, Item* item) {
    QueueItem* queue_item = (QueueItem*)malloc(sizeof(QueueItem));
    queue_item->item = item;
    queue_item->next = 0;
    add(item_queue, queue_item);
}